

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
          (RaceSuccessfulPromiseNodeBase *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises,
          ExceptionOrValue *output,SourceLocation location)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar4;
  Range<unsigned_long> RVar5;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> local_98;
  uint local_7c;
  Iterator IStack_78;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> builder;
  ExceptionOrValue *output_local;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises_local;
  RaceSuccessfulPromiseNodeBase *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00d9ab88;
  this->output = output;
  sVar2 = Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::size(promises);
  this->countLeft = (uint)sVar2;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  this->armed = false;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::Array(&this->branches);
  sVar2 = Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::size(promises);
  heapArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>
            ((ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)&__range2,sVar2);
  RVar5 = indices<kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>&>(promises);
  __begin2.value = RVar5.begin_;
  __end2 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
  IStack_78 = Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator==(&__end2,&stack0xffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = Range<unsigned_long>::Iterator::operator*(&__end2);
    local_7c = (uint)*puVar3;
    pOVar4 = Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::operator[]
                       (promises,(ulong)local_7c);
    pOVar4 = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(pOVar4);
    ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::
    add<kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              ((ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)&__range2,this,pOVar4,
               &location);
    Range<unsigned_long>::Iterator::operator++(&__end2);
  }
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::finish
            (&local_98,(ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)&__range2);
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::operator=(&this->branches,&local_98);
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::~Array(&local_98);
  sVar2 = Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::size(&this->branches);
  if (sVar2 == 0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::~ArrayBuilder
            ((ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)&__range2);
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase(
    Array<OwnPromiseNode> promises, ExceptionOrValue &output,
    SourceLocation location)
    : output(output), countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i : indices(promises)) {
    builder.add(*this, kj::mv(promises[i]), location);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}